

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O1

string * __thiscall
t_swift_generator::function_result_helper_struct_type_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_service *tservice,
          t_function *tfunction)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  size_type *psVar4;
  long *plVar5;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  if (tfunction->oneway_ == true) {
    iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
    plVar6 = &local_50;
    lVar1 = *(long *)CONCAT44(extraout_var,iVar2);
    local_60 = plVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,lVar1,((long *)CONCAT44(extraout_var,iVar2))[1] + lVar1);
    std::__cxx11::string::append((char *)&local_60);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_60,(ulong)(tfunction->name_)._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar4) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = local_60;
  }
  else {
    iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
    plVar6 = local_30;
    lVar1 = *(long *)CONCAT44(extraout_var_00,iVar2);
    local_40[0] = plVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,lVar1,((long *)CONCAT44(extraout_var_00,iVar2))[1] + lVar1);
    std::__cxx11::string::append((char *)local_40);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_40,(ulong)(tfunction->name_)._M_dataplus._M_p);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_50 = *plVar5;
      lStack_48 = plVar3[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar5;
      local_60 = (long *)*plVar3;
    }
    local_58 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar4) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = local_40[0];
    if (local_60 != &local_50) {
      operator_delete(local_60);
      plVar3 = local_40[0];
    }
  }
  if (plVar3 != plVar6) {
    operator_delete(plVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::function_result_helper_struct_type(t_service *tservice, t_function* tfunction) {
  if (tfunction->is_oneway()) {
    return tservice->get_name() + "_" + tfunction->get_name();
  } else {
    return tservice->get_name() + "_" + tfunction->get_name() + "_result";
  }
}